

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O3

void __thiscall
MetadataMultilayerEncodeTest_Test_Test::~MetadataMultilayerEncodeTest_Test_Test
          (MetadataMultilayerEncodeTest_Test_Test *this)

{
  aom_enc_frame_flags_t *this_00;
  
  this_00 = &this[-1].super_MetadataMultilayerEncodeTest.super_EncoderTest.frame_flags_;
  anon_unknown.dwarf_23b5af3::MetadataMultilayerEncodeTest::~MetadataMultilayerEncodeTest
            ((MetadataMultilayerEncodeTest *)this_00);
  operator_delete(this_00);
  return;
}

Assistant:

TEST_P(MetadataMultilayerEncodeTest, Test) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 0;
  cfg_.rc_target_bitrate = 1200;

  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, /*limit=*/10);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}